

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

int sockpp::result<unsigned_long>::get_last_errno(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  return *piVar1;
}

Assistant:

static int get_last_errno() {
#if defined(_WIN32)
        return ::WSAGetLastError();
#else
        int err = errno;
        return err;
#endif
    }